

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void transform_reg_to_var_and_decl(List *code)

{
  int local_2820;
  int local_281c;
  int i;
  int sgnd;
  char decls [2] [5] [1024];
  List *code_local;
  
  for (local_2820 = 0; local_2820 < 5; local_2820 = local_2820 + 1) {
    decls[0][(long)local_2820 + 4][0x3f8] = '\0';
    *(undefined1 *)(&i + (long)local_2820 * 0x100) = 0;
  }
  transform_rtvad_aux(code,code,(char (*) [5] [1024])&i);
  for (local_281c = 0; local_281c < 2; local_281c = local_281c + 1) {
    for (local_2820 = 1; local_2820 < 5; local_2820 = local_2820 + 1) {
      if ((char)(&i)[(long)local_281c * 0x500 + (long)local_2820 * 0x100] != '\0') {
        fprintf((FILE *)syn68k_c_stream,"        %s%s;\n",ctypes[local_281c][local_2820],
                &i + (long)local_281c * 0x500 + (long)local_2820 * 0x100);
      }
    }
  }
  return;
}

Assistant:

static void
transform_reg_to_var_and_decl (List *code)
{
#if	!defined(TEMPS_AT_TOP)
  char decls[2][5][1024];  /* decls[signed][byte size][variable names] */
  int sgnd, i;

  /* Clear out all decls. */
  for (i = 0; i < 5; i++)
    decls[0][i][0] = decls[1][i][0] = '\0';

  /* Recursively make all the transformations and declarations. */
  transform_rtvad_aux (code, code, decls);

  /* Loop through and output decls for each variable type that we use. */
  for (sgnd = 0; sgnd <= 1; sgnd++)
    for (i = 1; i < 5; i++)
      {
	if (decls[sgnd][i][0] != '\0')
	  fprintf (syn68k_c_stream, "        %s%s;\n", ctypes[sgnd][i],
		   decls[sgnd][i]);
      }
#endif
}